

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurvey.c
# Opt level: O0

void xsurv0_putq_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *m;
  xsurv0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x1f0));
  if (nVar1 == NNG_OK) {
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x580));
  }
  else {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x1f0));
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x1f0),(nni_msg *)0x0);
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xsurv0_putq_cb(void *arg)
{
	xsurv0_pipe *p = arg;

	if (nni_aio_result(&p->aio_putq) != 0) {
		nni_msg_free(nni_aio_get_msg(&p->aio_putq));
		nni_aio_set_msg(&p->aio_putq, NULL);
		nni_pipe_close(p->npipe);
		return;
	}

	nni_pipe_recv(p->npipe, &p->aio_recv);
}